

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestParseArrayDelete(void)

{
  FILE *pFVar1;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> this;
  ValueTypes VVar2;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> *ppBVar3;
  __tuple_element_t<0UL,_tuple<ParseResults,_BubbleValue_*>_> *p_Var4;
  size_t sVar5;
  char *bubbleValue;
  BubbleJson local_30;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> local_20;
  BubbleValue *value;
  tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> result;
  
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::tuple<true,_true>
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  bubbleJson::BubbleJson::Parse(&local_30,(char *)&gm_BubbleJson);
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)&local_30);
  ppBVar3 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar3;
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var4 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x165,0,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar2 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar2 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar2 = bubbleJson::BubbleValue::GetType(local_20);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x166,5,(ulong)VVar2);
    g_Result = 1;
  }
  bubbleJson::BubbleValue::DeleteArrayElementWithIndex(local_20,0);
  bubbleValue = (char *)0x0;
  bubbleJson::BubbleValue::DeleteArrayElementWithIndex(local_20,0);
  g_TestCount = g_TestCount + 1;
  VVar2 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar2 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar2 = bubbleJson::BubbleValue::GetType(local_20);
    bubbleValue = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x16c,5,(ulong)VVar2);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar5 = bubbleJson::BubbleValue::GetArrayCount(local_20);
  pFVar1 = _stderr;
  if (sVar5 == 0) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar5 = bubbleJson::BubbleValue::GetArrayCount(local_20);
    bubbleValue = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x16d,0,sVar5);
    g_Result = 1;
  }
  this = local_20;
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(this,bubbleValue);
  }
  return;
}

Assistant:

static void TestParseArrayDelete()
{
    tuple<ParseResults, BubbleValue*> result;
    BubbleValue *value;

    result = gm_BubbleJson.Parse(" [ true, false ] ");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Array, value->GetType());

    value->DeleteArrayElementWithIndex(0);
    value->DeleteArrayElementWithIndex(0);

    //expect [ ]
    EXPECT_EQ_INT(ValueType_Array, value->GetType());
    EXPECT_EQ_SIZE_T(0, value->GetArrayCount());

    delete value;
}